

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

pair<double,_double>
Function_Template::template_Accumulate
          (AccumulateForm1 Accumulate,string *namespaceName,uint32_t size)

{
  byte bVar1;
  uint32_t uVar2;
  ulong __n;
  int in_EDX;
  code *in_RDI;
  uint32_t i;
  TimerContainer timer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  Image image;
  Image *in_stack_fffffffffffffef0;
  allocator_type *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff04;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  uint local_cc;
  BaseTimerContainer *in_stack_ffffffffffffff50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a5 [3];
  ImageTemplate<unsigned_char> local_50;
  int local_24;
  code *local_18;
  pair<double,_double> local_10;
  
  local_24 = in_EDX;
  local_18 = in_RDI;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffef8,(uint8_t)((ulong)in_stack_fffffffffffffef0 >> 0x38)
             ,(uint8_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
  Test_Helper::uniformImage
            ((uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x17282f);
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(&local_50);
  __n = (ulong)(local_24 * local_24 * (uint)bVar1);
  local_a5[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._1_4_ = 0;
  this = local_a5;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x17287a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (this,__n,(value_type *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x17289f);
  SetupFunction((string *)0x1728ac);
  Performance_Test::TimerContainer::TimerContainer((TimerContainer *)in_stack_fffffffffffffef0);
  local_cc = 0;
  while( true ) {
    uVar3 = local_cc;
    uVar2 = Test_Helper::runCount();
    if (uVar2 <= uVar3) break;
    Performance_Test::TimerContainer::start((TimerContainer *)in_stack_fffffffffffffef0);
    (*local_18)(&local_50,
                (undefined1 *)
                ((long)&local_a5[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + 5));
    Performance_Test::TimerContainer::stop((TimerContainer *)CONCAT44(uVar2,uVar3));
    local_cc = local_cc + 1;
  }
  CleanupFunction((string *)0x1729d0);
  local_10 = Performance_Test::BaseTimerContainer::mean(in_stack_ffffffffffffff50);
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)0x172a12);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar2,uVar3));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x172a29);
  return local_10;
}

Assistant:

std::pair < double, double > template_Accumulate( AccumulateForm1 Accumulate , const std::string & namespaceName, uint32_t size )
    {
        const PenguinV_Image::Image image = Performance_Test::uniformImage( size, size );
        std::vector < uint32_t > result( size * size * image.colorCount(), 0u );

        TEST_FUNCTION_LOOP( Accumulate( image, result ), namespaceName )
    }